

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alg.cpp
# Opt level: O1

double __thiscall
Alg::max_cover_lazy_budget_fast_end
          (Alg *this,Graph *graph,double budget,vector<double,_std::allocator<double>_> *budget_list
          ,double epsilon,double *timeb,int mode)

{
  vector<unsigned_int,std::allocator<unsigned_int>> *pvVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  pointer *ppuVar2;
  undefined8 uVar3;
  size_t sVar4;
  iterator iVar5;
  pointer pvVar6;
  pointer pdVar7;
  pointer puVar8;
  double dVar9;
  pointer pvVar10;
  ulong *puVar11;
  pointer pvVar12;
  uint *puVar13;
  pointer puVar14;
  void *pvVar15;
  pointer ppVar16;
  double *pdVar17;
  uint uVar18;
  ulong uVar19;
  ostream *poVar20;
  Nodelist *this_01;
  uint *puVar21;
  long extraout_RAX;
  long extraout_RAX_00;
  long extraout_RAX_01;
  pointer puVar22;
  ulong *puVar23;
  long extraout_RAX_02;
  long lVar24;
  double *pdVar25;
  pointer ppVar26;
  pointer *ppuVar27;
  undefined1 auVar28 [8];
  size_type sVar29;
  ulong uVar30;
  ulong uVar31;
  undefined8 *puVar32;
  long lVar33;
  ulong uVar34;
  int iVar35;
  long lVar36;
  double *pdVar37;
  __normal_iterator<std::pair<unsigned_long,_double>_*,_std::vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>_>
  __i;
  ulong uVar38;
  long lVar39;
  pointer ppVar40;
  Alg *pAVar41;
  long lVar42;
  size_type sVar43;
  long lVar44;
  char cVar45;
  bool bVar46;
  double dVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  double dVar55;
  undefined1 auVar56 [16];
  vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
  vecNodeLastPair;
  vector<double,_std::allocator<double>_> coverage_cost;
  value_type argmaxIdx_1;
  vector<bool,_std::allocator<bool>_> edgeMark_cost;
  RRsets degMap_cost;
  vector<bool,_std::allocator<bool>_> node_sel_cost;
  RRsets missMap_cost;
  vector<bool,_std::allocator<bool>_> edgeMark;
  vector<unsigned_long,_std::allocator<unsigned_long>_> miss_nodes_vec;
  vector<bool,_std::allocator<bool>_> node_sel;
  FRset coverage;
  RRsets degMap;
  undefined8 local_298;
  double local_280;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_278;
  vector<double,_std::allocator<double>_> *local_258;
  Alg *local_250;
  vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
  local_248;
  uint local_22c;
  ulong local_228;
  vector<double,_std::allocator<double>_> local_220;
  double local_208;
  int local_200;
  uint local_1fc;
  undefined1 local_1f8 [8];
  _Bit_type *p_Stack_1f0;
  _Bit_type *local_1e8;
  uint local_1e0;
  _Bit_pointer local_1d8;
  ulong local_1d0;
  double local_1c8;
  undefined8 uStack_1c0;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_1b8;
  size_type local_1a0;
  long local_198;
  long local_190;
  double local_188;
  vector<bool,_std::allocator<bool>_> local_180;
  double local_158;
  undefined8 uStack_150;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_148;
  vector<bool,_std::allocator<bool>_> local_130;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_108;
  vector<bool,_std::allocator<bool>_> local_e8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_c0;
  double local_a8;
  double dStack_a0;
  double local_98;
  long local_90;
  long local_88;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_80;
  double local_68;
  undefined8 uStack_60;
  vector<unsigned_int,std::allocator<unsigned_int>> *local_58;
  double *local_50;
  long local_48;
  pointer local_40;
  long local_38;
  
  this->__boundLast = 1.79769313486232e+308;
  this->__boundMin = 1.79769313486232e+308;
  this->__boundLast_inf = 1.79769313486232e+308;
  this->__boundMin_inf = 1.79769313486232e+308;
  this->__boundLast_inf_cost = 1.79769313486232e+308;
  this->__boundMin_inf_cost = 1.79769313486232e+308;
  local_130.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_258 = budget_list;
  local_208 = epsilon;
  local_200 = mode;
  local_50 = timeb;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_c0,(ulong)this->__numV,(value_type_conflict2 *)&local_130,
             (allocator_type *)&local_e8);
  uVar19 = (ulong)this->__numV;
  if (uVar19 == 0) {
    uVar38 = 0;
  }
  else {
    ppuVar27 = (pointer *)
               ((long)&(this->__hyperG)._FRsets.
                       super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar19 - 1].
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data + 8);
    uVar38 = 0;
    do {
      uVar30 = (long)*ppuVar27 - (long)((_Vector_impl_data *)(ppuVar27 + -1))->_M_start >> 3;
      if (uVar38 < uVar30) {
        uVar38 = uVar30;
      }
      ppuVar27 = ppuVar27 + -3;
      local_c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[uVar19 - 1] = uVar30;
      uVar19 = uVar19 - 1;
    } while (uVar19 != 0);
  }
  local_250 = this;
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector(&local_80,uVar38 + 1,(allocator_type *)&local_130);
  uVar18 = local_250->__numV - 1;
  local_130.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p =
       (_Bit_type *)
       CONCAT44(local_130.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._4_4_,uVar18);
  if (local_250->__numV != 0) {
    do {
      if (local_c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[uVar18] != 0) {
        pvVar1 = (vector<unsigned_int,std::allocator<unsigned_int>> *)
                 (local_80.
                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start +
                 local_c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar18]);
        iVar5._M_current = *(uint **)(pvVar1 + 8);
        if (iVar5._M_current == *(uint **)(pvVar1 + 0x10)) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>(pvVar1,iVar5,(uint *)&local_130);
        }
        else {
          *iVar5._M_current = uVar18;
          *(uint **)(pvVar1 + 8) = iVar5._M_current + 1;
        }
      }
      bVar46 = (int)local_130.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != 0;
      uVar18 = (int)local_130.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p - 1;
      local_130.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p =
           (_Bit_type *)
           CONCAT44(local_130.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._4_4_,uVar18);
    } while (bVar46);
  }
  pAVar41 = local_250;
  local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p =
       (_Bit_type *)
       ((ulong)local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
               _M_start.super__Bit_iterator_base._M_p & 0xffffffffffffff00);
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_130,local_250->__numRRsets,(bool *)&local_e8,(allocator_type *)local_1f8);
  local_1f8 = (undefined1  [8])((ulong)local_1f8 & 0xffffffffffffff00);
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_e8,(ulong)pAVar41->__numV,(bool *)local_1f8,(allocator_type *)&local_180);
  local_1c8 = min_vector_nonzero_mask(local_258,&local_e8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"min_cost: ",10);
  poVar20 = std::ostream::_M_insert<double>(local_1c8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar20 + -0x18) + (char)poVar20);
  std::ostream::put((char)poVar20);
  std::ostream::flush();
  puVar22 = (local_250->__vecSeed_inf).
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((local_250->__vecSeed_inf).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish != puVar22) {
    (local_250->__vecSeed_inf).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_finish = puVar22;
  }
  local_298 = 0.0;
  if ((local_1c8 <= budget) && (uVar38 != 0)) {
    this_01 = &local_250->__vecSeed_inf;
    local_298 = 0.0;
    iVar35 = 0;
    while( true ) {
      lVar42 = (long)local_80.
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar38].
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_80.
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar38].
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start;
      if (lVar42 != 0) {
        pvVar12 = local_80.
                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + uVar38;
        lVar42 = lVar42 >> 2;
        local_158 = (double)(uVar38 * 3);
        do {
          uVar18 = (pvVar12->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                   _M_impl.super__Vector_impl_data._M_start[lVar42 + -1];
          lVar42 = lVar42 + -1;
          local_180.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p =
               (_Bit_type *)
               CONCAT44(local_180.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._4_4_,uVar18
                       );
          if (local_c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[uVar18] < uVar38) {
            pvVar1 = (vector<unsigned_int,std::allocator<unsigned_int>> *)
                     (local_80.
                      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start +
                     local_c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar18]);
            iVar5._M_current = *(uint **)(pvVar1 + 8);
            if (iVar5._M_current == *(uint **)(pvVar1 + 0x10)) {
              cVar45 = '\n';
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>(pvVar1,iVar5,(uint *)&local_180);
            }
            else {
              *iVar5._M_current = uVar18;
              *(uint **)(pvVar1 + 8) = iVar5._M_current + 1;
              cVar45 = '\n';
            }
          }
          else {
            if ((local_258->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start[uVar18] <= budget) {
              if (local_200 == 2) {
                local_1f8 = (undefined1  [8])0x0;
                p_Stack_1f0 = (_Bit_type *)0x0;
                local_1e8 = (_Bit_type *)0x0;
                local_220.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start._0_4_ =
                     (undefined4)
                     local_c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start
                     [(&((local_80.
                          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                        super__Vector_impl_data._M_start)[(long)local_158][lVar42]];
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                _M_realloc_insert<unsigned_int>
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1f8,
                           (iterator)0x0,(uint *)&local_220);
                lVar33 = 0;
                for (auVar28 = local_1f8; auVar28 != (undefined1  [8])p_Stack_1f0;
                    auVar28 = (undefined1  [8])((long)auVar28 + 4)) {
                  lVar33 = lVar33 + (ulong)(uint)*(_Bit_type *)auVar28;
                }
                lVar33 = lVar33 + (long)local_298;
                auVar48._8_4_ = (int)((ulong)lVar33 >> 0x20);
                auVar48._0_8_ = lVar33;
                auVar48._12_4_ = 0x45300000;
                sVar4 = local_250->__numRRsets;
                auVar51._8_4_ = (int)(sVar4 >> 0x20);
                auVar51._0_8_ = sVar4;
                auVar51._12_4_ = 0x45300000;
                dVar47 = ((double)local_250->__numV *
                         ((auVar48._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)lVar33) - 4503599627370496.0))) /
                         ((auVar51._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)sVar4) - 4503599627370496.0));
                local_250->__boundLast_inf = dVar47;
                if (dVar47 < local_250->__boundMin_inf) {
                  local_250->__boundMin_inf = dVar47;
                }
                if (local_1f8 != (undefined1  [8])0x0) {
                  operator_delete((void *)local_1f8,(long)local_1e8 - (long)local_1f8);
                }
              }
              if (iVar35 == 0) {
                local_298 = (double)((long)local_298 +
                                    local_c0.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start
                                    [(ulong)local_180.super__Bvector_base<std::allocator<bool>_>.
                                            _M_impl.super__Bvector_impl_data._M_start.
                                            super__Bit_iterator_base._M_p & 0xffffffff]);
                iVar5._M_current =
                     (local_250->__vecSeed_inf).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                if (iVar5._M_current ==
                    (local_250->__vecSeed_inf).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<unsigned_int,std::allocator<unsigned_int>>::
                  _M_realloc_insert<unsigned_int_const&>
                            ((vector<unsigned_int,std::allocator<unsigned_int>> *)this_01,iVar5,
                             (uint *)&local_180);
                }
                else {
                  *iVar5._M_current =
                       (uint)local_180.super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
                  (local_250->__vecSeed_inf).
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish = iVar5._M_current + 1;
                }
                uVar19 = (ulong)local_180.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p &
                         0xffffffff;
                local_c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[uVar19] = 0;
                pvVar10 = (local_250->__hyperG)._FRsets.
                          super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                puVar23 = pvVar10[uVar19].
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start;
                puVar11 = *(pointer *)
                           ((long)&pvVar10[uVar19].
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data + 8);
                if (puVar23 != puVar11) {
                  pvVar6 = (local_250->__hyperG)._RRsets.
                           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  do {
                    uVar19 = *puVar23;
                    uVar30 = uVar19 + 0x3f;
                    if (-1 < (long)uVar19) {
                      uVar30 = uVar19;
                    }
                    uVar34 = (ulong)((uVar19 & 0x800000000000003f) < 0x8000000000000001);
                    if ((local_130.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                         [((long)uVar30 >> 6) + (uVar34 - 1)] >> (uVar19 & 0x3f) & 1) == 0) {
                      local_130.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                      [((long)uVar30 >> 6) + (uVar34 - 1)] =
                           local_130.super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                           [((long)uVar30 >> 6) + (uVar34 - 1)] | 1L << ((byte)uVar19 & 0x3f);
                      puVar13 = *(pointer *)
                                 ((long)&pvVar6[uVar19].
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data + 8);
                      for (puVar21 = pvVar6[uVar19].
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_start; puVar21 != puVar13;
                          puVar21 = puVar21 + 1) {
                        if (local_c0.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start[*puVar21] != 0) {
                          local_c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start[*puVar21] =
                               local_c0.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start[*puVar21] - 1;
                        }
                      }
                    }
                    puVar23 = puVar23 + 1;
                  } while (puVar23 != puVar11);
                }
              }
              iVar35 = iVar35 + 1;
            }
            cVar45 = (iVar35 == 2) * '\t';
          }
        } while (((cVar45 == '\n') || (cVar45 == '\0')) && (lVar42 != 0));
      }
      if (iVar35 == 2) break;
      puVar22 = local_80.
                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish[-1].
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start;
      pvVar12 = local_80.
                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish + -1;
      if (puVar22 != (pointer)0x0) {
        pvVar12 = local_80.
                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish + -1;
        local_80.
        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_80.
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + -1;
        operator_delete(puVar22,(long)(pvVar12->
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      )._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)puVar22);
        pvVar12 = local_80.
                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      local_80.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pvVar12;
      if ((budget < local_1c8) || (uVar38 = uVar38 - 1, uVar38 == 0)) break;
    }
  }
  pAVar41 = local_250;
  uVar18 = local_250->__numV;
  local_158 = (double)local_250->__numRRsets;
  uStack_150 = 0;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"  >>>[greedy-lazy] influence: ",0x1e);
  poVar20 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar20," ",1);
  auVar53._8_4_ = (int)((ulong)local_298 >> 0x20);
  auVar53._0_8_ = local_298;
  auVar53._12_4_ = 0x45300000;
  auVar54._8_4_ = (int)((ulong)local_158 >> 0x20);
  auVar54._0_8_ = local_158;
  auVar54._12_4_ = 0x45300000;
  local_98 = ((double)uVar18 *
             ((auVar53._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,SUB84(local_298,0)) - 4503599627370496.0))) /
             ((auVar54._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,SUB84(local_158,0)) - 4503599627370496.0));
  poVar20 = std::ostream::_M_insert<double>(local_98);
  std::__ostream_insert<char,std::char_traits<char>>(poVar20,", min-bound: ",0xd);
  poVar20 = std::ostream::_M_insert<double>(pAVar41->__boundMin_inf);
  std::__ostream_insert<char,std::char_traits<char>>(poVar20,", last-bound: ",0xe);
  poVar20 = std::ostream::_M_insert<double>(pAVar41->__boundLast_inf);
  local_1f8[0] = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar20,local_1f8,1);
  local_1f8 = (undefined1  [8])0x0;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_220,(ulong)pAVar41->__numV,(value_type_conflict4 *)local_1f8,
             (allocator_type *)&local_180);
  iVar35 = local_200;
  uVar19 = (ulong)pAVar41->__numV;
  if (uVar19 == 0) {
    local_a8 = 0.0;
    dStack_a0 = 0.0;
    local_1c8 = 1.79769313486232e+308;
  }
  else {
    pdVar7 = (local_258->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    ppuVar27 = (pointer *)
               ((long)&(pAVar41->__hyperG)._FRsets.
                       super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar19 - 1].
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data + 8);
    local_1c8 = 1.79769313486232e+308;
    local_a8 = 0.0;
    do {
      dVar47 = pdVar7[uVar19 - 1];
      lVar42 = (long)*ppuVar27 - (long)((_Vector_impl_data *)(ppuVar27 + -1))->_M_start;
      auVar56._8_4_ = (int)(lVar42 >> 0x23);
      auVar56._0_8_ = lVar42 >> 3;
      auVar56._12_4_ = 0x45300000;
      dStack_a0 = auVar56._8_8_ - 1.9342813113834067e+25;
      dVar55 = (dStack_a0 + ((double)CONCAT44(0x43300000,(int)(lVar42 >> 3)) - 4503599627370496.0))
               / dVar47;
      if (lVar42 == 0 || ABS(dVar47) <= 1e-10) {
        dVar55 = 0.0;
        dStack_a0 = 0.0;
        dVar47 = local_1c8;
      }
      else {
        dVar47 = (double)(~-(ulong)(1e-10 < ABS(dVar55)) & (ulong)local_1c8 |
                         -(ulong)(1e-10 < ABS(dVar55)) & (ulong)dVar55);
      }
      ppuVar27 = ppuVar27 + -3;
      *(double *)
       (CONCAT44(local_220.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start._4_4_,
                 local_220.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start._0_4_) + -8 + uVar19 * 8) = dVar55;
      dVar9 = dVar55;
      if (dVar55 <= local_a8) {
        dVar9 = local_a8;
      }
      local_a8 = dVar9;
      local_1c8 = (double)(~-(ulong)(dVar55 < local_1c8) & (ulong)local_1c8 |
                          (ulong)dVar47 & -(ulong)(dVar55 < local_1c8));
      uVar19 = uVar19 - 1;
    } while (uVar19 != 0);
  }
  uStack_1c0 = 0;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"minDeg_cost: ",0xd);
  poVar20 = std::ostream::_M_insert<double>(local_1c8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar20 + -0x18) + (char)poVar20);
  std::ostream::put((char)poVar20);
  std::ostream::flush();
  local_158 = 1.0 - local_208;
  local_1c8 = local_1c8 * local_158;
  local_1a0 = 0;
  for (dVar47 = local_a8; local_1c8 <= dVar47; dVar47 = dVar47 * local_158) {
    local_1a0 = local_1a0 + 1;
  }
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector(&local_1b8,local_1a0,(allocator_type *)local_1f8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"maxIdx_cost: ",0xd);
  poVar20 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar20 + -0x18) + (char)poVar20);
  std::ostream::put((char)poVar20);
  std::ostream::flush();
  if (local_1c8 <= local_a8) {
    local_298 = local_a8;
    sVar43 = local_1a0;
    do {
      sVar43 = sVar43 - 1;
      uVar18 = pAVar41->__numV - 1;
      local_1f8._0_4_ = uVar18;
      if (pAVar41->__numV != 0) {
        dVar47 = local_298 / local_158;
        do {
          dVar55 = *(double *)
                    (CONCAT44(local_220.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start._4_4_,
                              local_220.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start._0_4_) + (ulong)uVar18 * 8);
          if ((local_298 <= dVar55) && (dVar55 <= dVar47)) {
            pvVar1 = (vector<unsigned_int,std::allocator<unsigned_int>> *)
                     (local_1b8.
                      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + sVar43);
            iVar5._M_current = *(uint **)(pvVar1 + 8);
            if (iVar5._M_current == *(uint **)(pvVar1 + 0x10)) {
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>(pvVar1,iVar5,(uint *)local_1f8);
            }
            else {
              *iVar5._M_current = uVar18;
              *(uint **)(pvVar1 + 8) = iVar5._M_current + 1;
            }
          }
          bVar46 = local_1f8._0_4_ != 0;
          uVar18 = local_1f8._0_4_ - 1;
          local_1f8._0_4_ = uVar18;
        } while (bVar46);
      }
    } while ((sVar43 != 0) && (local_298 = local_298 * local_158, local_1c8 <= local_298));
  }
  local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
  local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector(&local_148,local_1a0,(allocator_type *)local_1f8);
  local_180.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p =
       (_Bit_type *)
       ((ulong)local_180.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
               ._M_start.super__Bit_iterator_base._M_p & 0xffffffffffffff00);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_1f8,pAVar41->__numRRsets,
             (bool *)&local_180,(allocator_type *)&local_278);
  local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((ulong)local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_180,(ulong)pAVar41->__numV,(bool *)&local_278,(allocator_type *)&local_248);
  local_280 = min_vector_nonzero_mask(local_258,&local_180);
  std::chrono::_V2::system_clock::now();
  puVar22 = (pAVar41->__vecSeed_inf_cost).
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((pAVar41->__vecSeed_inf_cost).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish != puVar22) {
    (pAVar41->__vecSeed_inf_cost).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_finish = puVar22;
  }
  local_1d0 = 0;
  if (((long)local_1b8.
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)local_1b8.
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start != 0) && (local_280 <= budget)) {
    local_58 = (vector<unsigned_int,std::allocator<unsigned_int>> *)&pAVar41->__vecSeed_inf_cost;
    local_190 = ((long)local_1b8.
                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_1b8.
                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
    local_38 = local_1a0 * 0x18 + -0x18;
    local_188 = 0.0;
    local_1d0 = 0;
    do {
      lVar42 = local_190 + -1;
      local_88 = lVar42 * 3;
      local_40 = local_1b8.
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + lVar42;
      local_198 = local_190 + -2;
      lVar33 = (long)(local_40->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(local_40->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                     _M_impl.super__Vector_impl_data._M_start >> 2;
      local_190 = lVar42;
      do {
        lVar42 = lVar33 + -1;
        if (lVar33 == 0) break;
        local_1fc = (local_40->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_start[lVar42];
        puVar21 = (uint *)(ulong)local_1fc;
        dVar47 = *(double *)
                  (CONCAT44(local_220.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start._4_4_,
                            local_220.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start._0_4_) + (long)puVar21 * 8);
        dVar55 = (local_258->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start[(long)puVar21] + local_188;
        if (dVar55 <= budget) {
          uStack_60 = 0;
          local_68 = dVar47;
          if ((iVar35 == 2) || ((iVar35 == 1 && (budget < dVar55 + local_280)))) {
            local_90 = lVar42;
            local_48 = std::chrono::_V2::system_clock::now();
            lVar42 = local_88;
            sVar43 = local_1a0;
            local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start = (uint *)0x0;
            local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish = (uint *)0x0;
            local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
            if ((long)local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start != 0) {
              lVar44 = (long)local_108.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)local_108.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 3;
              do {
                lVar44 = lVar44 + -1;
                if (local_1c8 <= local_a8) {
                  dVar47 = *(double *)
                            (CONCAT44(local_220.super__Vector_base<double,_std::allocator<double>_>.
                                      _M_impl.super__Vector_impl_data._M_start._4_4_,
                                      local_220.super__Vector_base<double,_std::allocator<double>_>.
                                      _M_impl.super__Vector_impl_data._M_start._0_4_) +
                            local_108.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start[lVar44] * 8);
                  lVar24 = local_38;
                  sVar29 = sVar43;
                  dVar55 = local_a8;
                  do {
                    if ((dVar55 <= dVar47) && (dVar47 <= dVar55 / local_158)) {
                      this_00 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                ((long)&((local_148.
                                          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        )._M_impl.super__Vector_impl_data._M_start + lVar24);
                      local_248.
                      super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start._0_4_ =
                           (uint)local_108.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start[lVar44];
                      iVar5._M_current =
                           *(uint **)((long)&((local_148.
                                               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->
                                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                             )._M_impl.super__Vector_impl_data._M_finish + lVar24);
                      if (iVar5._M_current ==
                          *(uint **)((long)&((local_148.
                                              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->
                                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                            )._M_impl.super__Vector_impl_data._M_end_of_storage +
                                    lVar24)) {
                        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                        _M_realloc_insert<unsigned_int>(this_00,iVar5,(uint *)&local_248);
                      }
                      else {
                        *iVar5._M_current =
                             (uint)local_248.
                                   super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start;
                        (this_00->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                        _M_impl.super__Vector_impl_data._M_finish = iVar5._M_current + 1;
                      }
                      break;
                    }
                    sVar29 = sVar29 - 1;
                    if (sVar29 == 0) break;
                    lVar24 = lVar24 + -0x18;
                    dVar55 = dVar55 * local_158;
                  } while (local_1c8 <= dVar55);
                }
              } while (lVar44 != 0);
            }
            puVar22 = (&((local_148.
                          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                        super__Vector_impl_data._M_finish)[lVar42];
            puVar14 = (&((local_148.
                          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                        super__Vector_impl_data._M_start)[lVar42];
            if (local_280 <= budget) {
              local_298 = 0.0;
              lVar44 = 0;
              do {
                bVar46 = lVar33 == 0;
                lVar33 = lVar33 + -1;
                if (bVar46) {
                  lVar33 = -1;
                  break;
                }
                puVar8 = (&((local_1b8.
                             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                           super__Vector_impl_data._M_start)[lVar42];
                pdVar7 = (local_258->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start;
                if (budget < pdVar7[puVar8[lVar33]] + local_298) {
                  lVar24 = (long)((budget - local_298) *
                                 *(double *)
                                  (CONCAT44(local_220.
                                            super__Vector_base<double,_std::allocator<double>_>.
                                            _M_impl.super__Vector_impl_data._M_start._4_4_,
                                            local_220.
                                            super__Vector_base<double,_std::allocator<double>_>.
                                            _M_impl.super__Vector_impl_data._M_start._0_4_) +
                                  (ulong)puVar8[lVar33] * 8));
                  local_248.
                  super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start._0_4_ = (uint)lVar24;
                  if (local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_finish ==
                      local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage) {
                    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                    _M_realloc_insert<unsigned_int>
                              (&local_278,
                               (iterator)
                               local_278.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_248);
                    lVar24 = extraout_RAX;
                  }
                  else {
                    *local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish =
                         (uint)local_248.
                               super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                    local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_finish =
                         local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_finish + 1;
                  }
                  local_228 = CONCAT71((int7)((ulong)lVar24 >> 8),1);
                  local_298 = budget;
                  goto LAB_00109173;
                }
                local_248.
                super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_start._0_4_ =
                     (uint)(long)(*(double *)
                                   (CONCAT44(local_220.
                                             super__Vector_base<double,_std::allocator<double>_>.
                                             _M_impl.super__Vector_impl_data._M_start._4_4_,
                                             local_220.
                                             super__Vector_base<double,_std::allocator<double>_>.
                                             _M_impl.super__Vector_impl_data._M_start._0_4_) +
                                   (ulong)puVar8[lVar33] * 8) * pdVar7[puVar8[lVar33]]);
                if (local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_finish ==
                    local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                  _M_realloc_insert<unsigned_int>
                            (&local_278,
                             (iterator)
                             local_278.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_finish,(uint *)&local_248);
                }
                else {
                  *local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_finish =
                       (uint)local_248.
                             super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                  local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish + 1;
                }
                local_298 = local_298 +
                            (local_258->super__Vector_base<double,_std::allocator<double>_>)._M_impl
                            .super__Vector_impl_data._M_start
                            [(&((local_1b8.
                                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                               _M_impl.super__Vector_impl_data._M_start)[lVar42][lVar33]];
                lVar44 = lVar44 + 1;
              } while (local_280 + local_298 <= budget);
              local_228 = 0;
            }
            else {
              local_298 = 0.0;
              lVar44 = 0;
              local_228 = 0;
            }
LAB_00109173:
            lVar24 = lVar44;
            if (local_280 + local_298 <= budget) {
              lVar39 = (long)puVar22 - (long)puVar14 >> 2;
              lVar36 = lVar44 + lVar39;
              do {
                bVar46 = lVar39 == 0;
                lVar39 = lVar39 + -1;
                lVar24 = lVar36;
                if (bVar46) break;
                puVar22 = (&((local_148.
                              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                            .super__Vector_impl_data._M_start)[lVar42];
                pdVar7 = (local_258->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start;
                if (budget < pdVar7[puVar22[lVar39]] + local_298) {
                  lVar42 = (long)((budget - local_298) *
                                 *(double *)
                                  (CONCAT44(local_220.
                                            super__Vector_base<double,_std::allocator<double>_>.
                                            _M_impl.super__Vector_impl_data._M_start._4_4_,
                                            local_220.
                                            super__Vector_base<double,_std::allocator<double>_>.
                                            _M_impl.super__Vector_impl_data._M_start._0_4_) +
                                  (ulong)puVar22[lVar39] * 8));
                  local_248.
                  super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start._0_4_ = (uint)lVar42;
                  if (local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_finish ==
                      local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage) {
                    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                    _M_realloc_insert<unsigned_int>
                              (&local_278,
                               (iterator)
                               local_278.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_248);
                    lVar42 = extraout_RAX_02;
                  }
                  else {
                    *local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish =
                         (uint)local_248.
                               super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                    local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_finish =
                         local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_finish + 1;
                  }
                  local_228 = CONCAT71((int7)((ulong)lVar42 >> 8),1);
                  lVar24 = lVar44;
                  local_298 = budget;
                  break;
                }
                local_248.
                super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_start._0_4_ =
                     (uint)(long)(*(double *)
                                   (CONCAT44(local_220.
                                             super__Vector_base<double,_std::allocator<double>_>.
                                             _M_impl.super__Vector_impl_data._M_start._4_4_,
                                             local_220.
                                             super__Vector_base<double,_std::allocator<double>_>.
                                             _M_impl.super__Vector_impl_data._M_start._0_4_) +
                                   (ulong)puVar22[lVar39] * 8) * pdVar7[puVar22[lVar39]]);
                if (local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_finish ==
                    local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                  _M_realloc_insert<unsigned_int>
                            (&local_278,
                             (iterator)
                             local_278.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_finish,(uint *)&local_248);
                }
                else {
                  *local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_finish =
                       (uint)local_248.
                             super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                  local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish + 1;
                }
                local_298 = local_298 +
                            (local_258->super__Vector_base<double,_std::allocator<double>_>)._M_impl
                            .super__Vector_impl_data._M_start
                            [(&((local_148.
                                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                               _M_impl.super__Vector_impl_data._M_start)[lVar42][lVar39]];
                lVar44 = lVar44 + 1;
                lVar24 = lVar44;
              } while (local_280 + local_298 <= budget);
            }
            local_208 = 0.0;
            lVar44 = local_190;
            if (((char)local_228 == '\0') && (lVar42 = local_198, local_280 + local_298 <= budget))
            {
              for (; lVar42 != 0; lVar42 = lVar42 + -1) {
                lVar44 = (long)local_1b8.
                               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[lVar42].
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)local_1b8.
                               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[lVar42].
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start >> 2;
                puVar22 = local_148.
                          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[lVar42].
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_finish;
                puVar14 = local_148.
                          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[lVar42].
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start;
                lVar33 = lVar44;
                local_208 = local_298;
                if (local_280 + local_298 <= budget) {
                  lVar36 = 0;
                  do {
                    bVar46 = lVar33 == 0;
                    lVar33 = lVar33 + -1;
                    if (bVar46) {
                      lVar33 = -1;
                      lVar36 = lVar44;
                      break;
                    }
                    puVar8 = local_1b8.
                             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[lVar42].
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start;
                    pdVar7 = (local_258->super__Vector_base<double,_std::allocator<double>_>).
                             _M_impl.super__Vector_impl_data._M_start;
                    if (budget < pdVar7[puVar8[lVar33]] + local_298) {
                      lVar44 = (long)((budget - local_298) *
                                     *(double *)
                                      (CONCAT44(local_220.
                                                super__Vector_base<double,_std::allocator<double>_>.
                                                _M_impl.super__Vector_impl_data._M_start._4_4_,
                                                local_220.
                                                super__Vector_base<double,_std::allocator<double>_>.
                                                _M_impl.super__Vector_impl_data._M_start._0_4_) +
                                      (ulong)puVar8[lVar33] * 8));
                      local_248.
                      super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start._0_4_ = (uint)lVar44;
                      if (local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_finish ==
                          local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage) {
                        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                        _M_realloc_insert<unsigned_int>
                                  (&local_278,
                                   (iterator)
                                   local_278.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_248);
                        lVar44 = extraout_RAX_00;
                      }
                      else {
                        *local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_finish =
                             (uint)local_248.
                                   super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start;
                        local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_finish =
                             local_278.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_finish + 1;
                      }
                      local_228 = CONCAT71((int7)((ulong)lVar44 >> 8),1);
                      local_298 = budget;
                      break;
                    }
                    local_248.
                    super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start._0_4_ =
                         (uint)(long)(*(double *)
                                       (CONCAT44(local_220.
                                                 super__Vector_base<double,_std::allocator<double>_>
                                                 ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                                 local_220.
                                                 super__Vector_base<double,_std::allocator<double>_>
                                                 ._M_impl.super__Vector_impl_data._M_start._0_4_) +
                                       (ulong)puVar8[lVar33] * 8) * pdVar7[puVar8[lVar33]]);
                    if (local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_finish ==
                        local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage) {
                      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                      _M_realloc_insert<unsigned_int>
                                (&local_278,
                                 (iterator)
                                 local_278.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_248);
                    }
                    else {
                      *local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish =
                           (uint)local_248.
                                 super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start;
                      local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_finish =
                           local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_finish + 1;
                    }
                    local_298 = local_298 +
                                (local_258->super__Vector_base<double,_std::allocator<double>_>).
                                _M_impl.super__Vector_impl_data._M_start
                                [local_1b8.
                                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[lVar42].
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start[lVar33]];
                    lVar36 = lVar36 + 1;
                  } while (local_280 + local_298 <= budget);
                }
                else {
                  lVar36 = 0;
                }
                lVar24 = lVar36;
                if (local_280 + local_298 <= budget) {
                  lVar39 = (long)puVar22 - (long)puVar14 >> 2;
                  lVar44 = lVar36 + lVar39;
                  do {
                    bVar46 = lVar39 == 0;
                    lVar39 = lVar39 + -1;
                    lVar24 = lVar44;
                    if (bVar46) break;
                    puVar22 = local_148.
                              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[lVar42].
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start;
                    pdVar7 = (local_258->super__Vector_base<double,_std::allocator<double>_>).
                             _M_impl.super__Vector_impl_data._M_start;
                    if (budget < pdVar7[puVar22[lVar39]] + local_298) {
                      lVar44 = (long)((budget - local_298) *
                                     *(double *)
                                      (CONCAT44(local_220.
                                                super__Vector_base<double,_std::allocator<double>_>.
                                                _M_impl.super__Vector_impl_data._M_start._4_4_,
                                                local_220.
                                                super__Vector_base<double,_std::allocator<double>_>.
                                                _M_impl.super__Vector_impl_data._M_start._0_4_) +
                                      (ulong)puVar22[lVar39] * 8));
                      local_248.
                      super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start._0_4_ = (uint)lVar44;
                      if (local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_finish ==
                          local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage) {
                        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                        _M_realloc_insert<unsigned_int>
                                  (&local_278,
                                   (iterator)
                                   local_278.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_248);
                        lVar44 = extraout_RAX_01;
                      }
                      else {
                        *local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_finish =
                             (uint)local_248.
                                   super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start;
                        local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_finish =
                             local_278.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_finish + 1;
                      }
                      local_228 = CONCAT71((int7)((ulong)lVar44 >> 8),1);
                      lVar24 = lVar36;
                      local_298 = budget;
                      break;
                    }
                    local_248.
                    super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start._0_4_ =
                         (uint)(long)(*(double *)
                                       (CONCAT44(local_220.
                                                 super__Vector_base<double,_std::allocator<double>_>
                                                 ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                                 local_220.
                                                 super__Vector_base<double,_std::allocator<double>_>
                                                 ._M_impl.super__Vector_impl_data._M_start._0_4_) +
                                       (ulong)puVar22[lVar39] * 8) * pdVar7[puVar22[lVar39]]);
                    if (local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_finish ==
                        local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage) {
                      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                      _M_realloc_insert<unsigned_int>
                                (&local_278,
                                 (iterator)
                                 local_278.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_248);
                    }
                    else {
                      *local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish =
                           (uint)local_248.
                                 super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start;
                      local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_finish =
                           local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_finish + 1;
                    }
                    local_298 = local_298 +
                                (local_258->super__Vector_base<double,_std::allocator<double>_>).
                                _M_impl.super__Vector_impl_data._M_start
                                [local_148.
                                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[lVar42].
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start[lVar39]];
                    lVar36 = lVar36 + 1;
                    lVar24 = lVar36;
                  } while (local_280 + local_298 <= budget);
                }
                lVar44 = lVar42;
                if (((local_228 & 1) != 0) || (budget < local_280 + local_298)) goto LAB_00109603;
              }
              lVar44 = 0;
            }
LAB_00109603:
            lVar42 = local_90;
            if ((lVar24 == 0) || (lVar33 == 0)) {
              if ((local_298 < budget) && (lVar33 == 0)) {
                lVar44 = lVar44 + -1;
                puVar22 = local_1b8.
                          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[lVar44].
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start;
                lVar33 = (long)local_1b8.
                               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[lVar44].
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_finish - (long)puVar22;
                if (lVar33 == 0) {
                  dVar47 = 0.0;
                }
                else {
                  lVar33 = lVar33 >> 2;
                  dVar47 = 0.0;
                  do {
                    dVar55 = *(double *)
                              (CONCAT44(local_220.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_start._4_4_,
                                        local_220.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_start._0_4_) +
                              (ulong)puVar22[lVar33 + -1] * 8);
                    if (dVar55 <= dVar47) {
                      dVar55 = dVar47;
                    }
                    dVar47 = dVar55;
                    lVar33 = lVar33 + -1;
                  } while (lVar33 != 0);
                }
                puVar22 = local_148.
                          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[lVar44].
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start;
                lVar33 = (long)local_148.
                               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[lVar44].
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_finish - (long)puVar22;
                if (lVar33 != 0) {
                  lVar33 = lVar33 >> 2;
                  dVar55 = dVar47;
                  do {
                    dVar47 = *(double *)
                              (CONCAT44(local_220.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_start._4_4_,
                                        local_220.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_start._0_4_) +
                              (ulong)puVar22[lVar33 + -1] * 8);
                    if (dVar47 <= dVar55) {
                      dVar47 = dVar55;
                    }
                    lVar33 = lVar33 + -1;
                    dVar55 = dVar47;
                  } while (lVar33 != 0);
                }
                local_248.
                super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_start._0_4_ =
                     (uint)(long)((budget - local_298) * dVar47);
                if (local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_finish ==
                    local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                  _M_realloc_insert<unsigned_int>
                            (&local_278,
                             (iterator)
                             local_278.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_finish,(uint *)&local_248);
                }
                else {
                  *local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_finish =
                       (uint)local_248.
                             super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                  local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish + 1;
                }
              }
            }
            else {
              local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_finish + -lVar24;
              std::
              vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
              ::vector(&local_248,
                       ((long)local_148.
                              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[lVar44].
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)local_148.
                              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[lVar44].
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start >> 2) +
                       ((long)local_1b8.
                              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[lVar44].
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)local_1b8.
                              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[lVar44].
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start >> 2),
                       (allocator_type *)&local_22c);
              ppVar16 = local_248.
                        super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              puVar22 = local_1b8.
                        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[lVar44].
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start;
              puVar14 = local_1b8.
                        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[lVar44].
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_finish;
              lVar42 = (long)puVar14 - (long)puVar22 >> 2;
              if (puVar14 != puVar22) {
                puVar32 = (undefined8 *)
                          (CONCAT44(local_248.
                                    super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                    (uint)local_248.
                                          super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start) + lVar42 * 0x10
                          + -8);
                lVar33 = lVar42;
                do {
                  lVar24 = lVar33 + -1;
                  lVar33 = lVar33 + -1;
                  uVar3 = *(undefined8 *)
                           (CONCAT44(local_220.super__Vector_base<double,_std::allocator<double>_>.
                                     _M_impl.super__Vector_impl_data._M_start._4_4_,
                                     local_220.super__Vector_base<double,_std::allocator<double>_>.
                                     _M_impl.super__Vector_impl_data._M_start._0_4_) +
                           (ulong)puVar22[lVar24] * 8);
                  puVar32[-1] = (ulong)puVar22[lVar24];
                  *puVar32 = uVar3;
                  puVar32 = puVar32 + -2;
                } while (lVar33 != 0);
              }
              puVar22 = local_148.
                        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[lVar44].
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start;
              lVar33 = (long)local_148.
                             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[lVar44].
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_finish - (long)puVar22;
              if (lVar33 != 0) {
                lVar24 = lVar33 >> 2;
                puVar32 = (undefined8 *)
                          (lVar42 * 0x10 + lVar33 * 4 +
                           CONCAT44(local_248.
                                    super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                    (uint)local_248.
                                          super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start) + -8);
                do {
                  uVar19 = (ulong)puVar22[lVar24 + -1];
                  lVar24 = lVar24 + -1;
                  uVar3 = *(undefined8 *)
                           (CONCAT44(local_220.super__Vector_base<double,_std::allocator<double>_>.
                                     _M_impl.super__Vector_impl_data._M_start._4_4_,
                                     local_220.super__Vector_base<double,_std::allocator<double>_>.
                                     _M_impl.super__Vector_impl_data._M_start._0_4_) + uVar19 * 8);
                  puVar32[-1] = uVar19;
                  *puVar32 = uVar3;
                  puVar32 = puVar32 + -2;
                } while (lVar24 != 0);
              }
              ppVar26 = (pointer)CONCAT44(local_248.
                                          super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                          (uint)local_248.
                                                super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start);
              if (ppVar26 !=
                  local_248.
                  super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
                lVar33 = (long)local_248.
                               super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar26;
                uVar19 = lVar33 >> 4;
                lVar42 = 0x3f;
                if (uVar19 != 0) {
                  for (; uVar19 >> lVar42 == 0; lVar42 = lVar42 + -1) {
                  }
                }
                std::
                __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,double>*,std::vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<Alg::max_cover_lazy_budget_fast_end(std::vector<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,std::allocator<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>>>const&,double,std::vector<double,std::allocator<double>>const&,double,double&,int)::__0>>
                          (ppVar26,local_248.
                                   super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish,
                           ((uint)lVar42 ^ 0x3f) * 2 ^ 0x7e);
                if (lVar33 < 0x101) {
                  std::
                  __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,double>*,std::vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>>,__gnu_cxx::__ops::_Iter_comp_iter<Alg::max_cover_lazy_budget_fast_end(std::vector<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,std::allocator<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>>>const&,double,std::vector<double,std::allocator<double>>const&,double,double&,int)::__0>>
                            (ppVar26,ppVar16);
                }
                else {
                  ppVar40 = ppVar26 + 0x10;
                  std::
                  __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,double>*,std::vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>>,__gnu_cxx::__ops::_Iter_comp_iter<Alg::max_cover_lazy_budget_fast_end(std::vector<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,std::allocator<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>>>const&,double,std::vector<double,std::allocator<double>>const&,double,double&,int)::__0>>
                            (ppVar26,ppVar40);
                  if (ppVar40 != ppVar16) {
                    pdVar37 = &ppVar26[0x10].second;
                    do {
                      dVar9 = (double)ppVar40->first;
                      dVar47 = ppVar40->second;
                      dVar55 = ppVar40[-1].second;
                      ppVar26 = ppVar40;
                      pdVar17 = pdVar37;
                      if (dVar47 < dVar55) {
                        do {
                          pdVar25 = pdVar17;
                          ((pair<unsigned_long,_double> *)(pdVar25 + -1))->first =
                               (unsigned_long)pdVar25[-3];
                          *pdVar25 = dVar55;
                          dVar55 = pdVar25[-4];
                          pdVar17 = pdVar25 + -2;
                        } while (dVar47 < dVar55);
                        ppVar26 = (pointer)(pdVar25 + -3);
                      }
                      ppVar26->first = (unsigned_long)dVar9;
                      ppVar26->second = dVar47;
                      ppVar40 = ppVar40 + 1;
                      pdVar37 = pdVar37 + 2;
                    } while (ppVar40 != ppVar16);
                  }
                }
              }
              if (local_280 + local_208 <= budget) {
                lVar42 = (long)local_148.
                               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[lVar44].
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)local_148.
                               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[lVar44].
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start >> 2;
                lVar33 = (long)local_1b8.
                               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[lVar44].
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)local_1b8.
                               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[lVar44].
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start >> 2;
                lVar44 = (lVar42 + lVar33) * 0x10;
                lVar42 = lVar42 + lVar33 + 1;
                do {
                  lVar44 = lVar44 + -0x10;
                  lVar42 = lVar42 + -1;
                  if (lVar42 == 0) break;
                  lVar33 = *(long *)(CONCAT44(local_248.
                                              super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                              (uint)local_248.
                                                                                                        
                                                  super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) +
                                    lVar44);
                  dVar47 = (local_258->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data._M_start[lVar33];
                  if (local_208 + dVar47 <= budget) {
                    local_22c = (uint)(long)(dVar47 * *(double *)
                                                       (CONCAT44(local_220.
                                                                                                                                  
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                                  local_220.
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._0_4_) +
                                                  lVar33 * 8));
                    if (local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_finish ==
                        local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage) {
                      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                      _M_realloc_insert<unsigned_int>
                                (&local_278,
                                 (iterator)
                                 local_278.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish,&local_22c);
                    }
                    else {
                      *local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish = local_22c;
                      local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_finish =
                           local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_finish + 1;
                    }
                    local_208 = local_208 +
                                (local_258->super__Vector_base<double,_std::allocator<double>_>).
                                _M_impl.super__Vector_impl_data._M_start
                                [*(long *)(CONCAT44(local_248.
                                                                                                        
                                                  super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                                  (uint)local_248.
                                                                                                                
                                                  super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) +
                                          lVar44)];
                  }
                  else {
                    local_22c = (uint)(long)((budget - local_208) *
                                            *(double *)
                                             (CONCAT44(local_220.
                                                                                                              
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                                  local_220.
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._0_4_) +
                                             lVar33 * 8));
                    if (local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_finish ==
                        local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage) {
                      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                      _M_realloc_insert<unsigned_int>
                                (&local_278,
                                 (iterator)
                                 local_278.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish,&local_22c);
                      local_208 = budget;
                    }
                    else {
                      *local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish = local_22c;
                      local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_finish =
                           local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_finish + 1;
                      local_208 = budget;
                    }
                  }
                } while (local_280 + local_208 <= budget);
              }
              pvVar15 = (void *)CONCAT44(local_248.
                                         super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                         (uint)local_248.
                                               super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start);
              lVar42 = local_90;
              if (pvVar15 != (void *)0x0) {
                operator_delete(pvVar15,(long)local_248.
                                              super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                        (long)pvVar15);
                lVar42 = local_90;
              }
            }
            puVar14 = local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
            puVar22 = local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            if (local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start !=
                local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              uVar19 = (long)local_278.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_finish -
                       (long)local_278.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start >> 2;
              lVar33 = 0x3f;
              if (uVar19 != 0) {
                for (; uVar19 >> lVar33 == 0; lVar33 = lVar33 + -1) {
                }
              }
              std::
              __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                        (local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start,
                         local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_finish,((uint)lVar33 ^ 0x3f) * 2 ^ 0x7e)
              ;
              std::
              __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                        (puVar22,puVar14);
            }
            iVar35 = local_200;
            pAVar41 = local_250;
            uVar19 = (long)local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 2;
            if ((1 < uVar19) && (1 < uVar19 + 1)) {
              uVar38 = uVar19 + 1 >> 1;
              do {
                uVar31 = uVar38 - 1;
                uVar18 = local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start[uVar38 - 1];
                uVar30 = uVar38 * 2 - 1;
                uVar34 = uVar31;
                if (uVar30 < uVar19) {
                  lVar33 = uVar38 * 2 + -2;
                  do {
                    if ((lVar33 + 2U == uVar19) ||
                       (uVar38 = lVar33 + 2U,
                       local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar30] <
                       local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start[lVar33 + 2])) {
                      uVar38 = uVar30;
                    }
                    if (uVar18 <= local_278.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start[uVar38]) break;
                    local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar34] =
                         local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start[uVar38];
                    lVar33 = uVar38 * 2;
                    uVar30 = uVar38 * 2 + 1;
                    uVar34 = uVar38;
                  } while (uVar30 < uVar19);
                }
                local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar34] = uVar18;
                uVar38 = uVar31;
              } while (uVar31 != 0);
            }
            lVar33 = 0;
            for (puVar22 = local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                puVar22 !=
                local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish; puVar22 = puVar22 + 1) {
              lVar33 = lVar33 + (ulong)*puVar22;
            }
            lVar33 = lVar33 + local_1d0;
            auVar49._8_4_ = (int)((ulong)lVar33 >> 0x20);
            auVar49._0_8_ = lVar33;
            auVar49._12_4_ = 0x45300000;
            sVar4 = local_250->__numRRsets;
            auVar52._8_4_ = (int)(sVar4 >> 0x20);
            auVar52._0_8_ = sVar4;
            auVar52._12_4_ = 0x45300000;
            dVar47 = ((double)local_250->__numV *
                     ((auVar49._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)lVar33) - 4503599627370496.0))) /
                     ((auVar52._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)sVar4) - 4503599627370496.0));
            local_250->__boundLast_inf_cost = dVar47;
            if (dVar47 < local_250->__boundMin_inf_cost) {
              local_250->__boundMin_inf_cost = dVar47;
            }
            lVar33 = std::chrono::_V2::system_clock::now();
            *local_50 = (double)(lVar33 - local_48) / 1000000000.0 + *local_50;
            if (local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start != (uint *)0x0) {
              operator_delete(local_278.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_278.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_278.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
          }
          auVar50._0_8_ = (double)CONCAT44(0x43300000,(int)local_1d0);
          auVar50._8_4_ = (int)(local_1d0 >> 0x20);
          auVar50._12_4_ = 0x45300000;
          local_68 = local_68 *
                     (local_258->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start[local_1fc] +
                     (auVar50._8_8_ - 1.9342813113834067e+25) + (auVar50._0_8_ - 4503599627370496.0)
          ;
          dVar47 = local_68 - 9.223372036854776e+18;
          iVar5._M_current =
               (pAVar41->__vecSeed_inf_cost).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar5._M_current ==
              (pAVar41->__vecSeed_inf_cost).
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>(local_58,iVar5,&local_1fc);
          }
          else {
            *iVar5._M_current = local_1fc;
            (pAVar41->__vecSeed_inf_cost).
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar5._M_current + 1;
          }
          local_1d0 = (long)dVar47 & (long)local_68 >> 0x3f | (long)local_68;
          uVar19 = (ulong)local_1fc;
          pdVar7 = (local_258->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          local_188 = local_188 + pdVar7[uVar19];
          lVar33 = CONCAT44(local_220.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start._4_4_,
                            local_220.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start._0_4_);
          *(undefined8 *)(lVar33 + uVar19 * 8) = 0;
          local_180.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p[local_1fc >> 6] =
               local_180.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
               ._M_start.super__Bit_iterator_base._M_p[local_1fc >> 6] |
               1L << ((byte)local_1fc & 0x3f);
          local_280 = min_vector_nonzero_mask(local_258,&local_180);
          pvVar10 = (pAVar41->__hyperG)._FRsets.
                    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          puVar23 = pvVar10[uVar19].
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start;
          puVar11 = *(pointer *)
                     ((long)&pvVar10[uVar19].
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data + 8);
          if (puVar23 != puVar11) {
            pvVar12 = (pAVar41->__hyperG)._RRsets.
                      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            do {
              uVar19 = *puVar23;
              uVar38 = uVar19 + 0x3f;
              if (-1 < (long)uVar19) {
                uVar38 = uVar19;
              }
              uVar30 = (ulong)((uVar19 & 0x800000000000003f) < 0x8000000000000001);
              if ((*(ulong *)((long)local_1f8 + (((long)uVar38 >> 6) + (uVar30 - 1)) * 8) >>
                   (uVar19 & 0x3f) & 1) == 0) {
                *(ulong *)((long)local_1f8 + (((long)uVar38 >> 6) + (uVar30 - 1)) * 8) =
                     *(ulong *)((long)local_1f8 + (((long)uVar38 >> 6) + (uVar30 - 1)) * 8) |
                     1L << ((byte)uVar19 & 0x3f);
                puVar13 = *(pointer *)
                           ((long)&pvVar12[uVar19].
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data + 8);
                for (puVar21 = pvVar12[uVar19].
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start; puVar21 != puVar13;
                    puVar21 = puVar21 + 1) {
                  uVar19 = (ulong)*puVar21;
                  dVar47 = *(double *)(lVar33 + uVar19 * 8);
                  if (1e-10 < ABS(dVar47)) {
                    dVar55 = pdVar7[uVar19];
                    *(ulong *)(lVar33 + uVar19 * 8) =
                         ~-(ulong)(ABS(dVar55) < 1e-10) & (ulong)((dVar47 * dVar55 + -1.0) / dVar55)
                    ;
                  }
                }
              }
              puVar23 = puVar23 + 1;
              pAVar41 = local_250;
            } while (puVar23 != puVar11);
          }
        }
        else if (1e-10 < ABS(dVar47)) {
          local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start = puVar21;
          if (local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
            _M_realloc_insert<unsigned_long>
                      (&local_108,
                       (iterator)
                       local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish,(unsigned_long *)&local_278);
          }
          else {
            *local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish = (unsigned_long)puVar21;
            local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_finish + 1;
          }
        }
        ppuVar2 = &((local_1b8.
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_finish + local_88;
        *ppuVar2 = *ppuVar2 + -1;
        lVar33 = lVar42;
      } while (local_188 + local_280 <= budget);
      puVar22 = local_1b8.
                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish[-1].
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start;
      pvVar12 = local_1b8.
                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish + -1;
      if (puVar22 != (pointer)0x0) {
        pvVar12 = local_1b8.
                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish + -1;
        local_1b8.
        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_1b8.
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + -1;
        operator_delete(puVar22,(long)(pvVar12->
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      )._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)puVar22);
        pvVar12 = local_1b8.
                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      local_1b8.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pvVar12;
    } while ((local_190 != 0) && (local_188 + local_280 <= budget));
  }
  uVar18 = pAVar41->__numV;
  sVar4 = pAVar41->__numRRsets;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"  >>>[greedy-lazy] influence_cost: ",0x23);
  poVar20 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar20," ",1);
  local_298._0_4_ = (undefined4)sVar4;
  local_298._4_4_ = (undefined4)(sVar4 >> 0x20);
  local_298 = ((double)uVar18 *
              (((double)CONCAT44(0x45300000,(int)(local_1d0 >> 0x20)) - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)local_1d0) - 4503599627370496.0))) /
              (((double)CONCAT44(0x45300000,local_298._4_4_) - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(undefined4)local_298) - 4503599627370496.0));
  poVar20 = std::ostream::_M_insert<double>(local_298);
  std::__ostream_insert<char,std::char_traits<char>>(poVar20,", min-bound_cost: ",0x12);
  poVar20 = std::ostream::_M_insert<double>(pAVar41->__boundMin_inf_cost);
  std::__ostream_insert<char,std::char_traits<char>>(poVar20,", last-bound_cost: ",0x13);
  poVar20 = std::ostream::_M_insert<double>(pAVar41->__boundLast_inf_cost);
  local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start._1_7_,10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar20,(char *)&local_278,1);
  puVar22 = (pAVar41->__vecSeed).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start;
  puVar14 = (pAVar41->__vecSeed).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (local_98 <= local_298) {
    if (puVar14 != puVar22) {
      (pAVar41->__vecSeed).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar22;
    }
    std::vector<unsigned_int,std::allocator<unsigned_int>>::
    _M_assign_aux<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)&pAVar41->__vecSeed,
               (pAVar41->__vecSeed_inf_cost).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start,
               (pAVar41->__vecSeed_inf_cost).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Cost Inf: ",10);
    poVar20 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar20 + -0x18) + (char)poVar20);
    std::ostream::put((char)poVar20);
    bVar46 = true;
    std::ostream::flush();
  }
  else {
    if (puVar14 != puVar22) {
      (pAVar41->__vecSeed).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar22;
    }
    std::vector<unsigned_int,std::allocator<unsigned_int>>::
    _M_assign_aux<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)&pAVar41->__vecSeed,
               (pAVar41->__vecSeed_inf).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start,
               (pAVar41->__vecSeed_inf).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Inf: ",5);
    poVar20 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar20 + -0x18) + (char)poVar20);
    std::ostream::put((char)poVar20);
    std::ostream::flush();
    bVar46 = false;
    local_298 = local_98;
  }
  pAVar41->__is_inf_cost = bVar46;
  if (local_180.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_180.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_180.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_180.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_180.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_180.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
    local_180.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_180.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_offset = 0;
    local_180.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  if (local_1f8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_1f8,(long)local_1d8 - (long)local_1f8);
    local_1f8 = (undefined1  [8])0x0;
    p_Stack_1f0 = (_Bit_type *)((ulong)p_Stack_1f0 & 0xffffffff00000000);
    local_1e8 = (_Bit_type *)0x0;
    local_1e0 = 0;
    local_1d8 = (_Bit_pointer)0x0;
  }
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&local_148);
  if (local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_108.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_108.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_108.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&local_1b8);
  pvVar15 = (void *)CONCAT44(local_220.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start._4_4_,
                             local_220.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start._0_4_);
  if (pvVar15 != (void *)0x0) {
    operator_delete(pvVar15,(long)local_220.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar15)
    ;
  }
  if (local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
    local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_offset = 0;
    local_e8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  if (local_130.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_130.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_130.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_130.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_130.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_130.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
    local_130.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_130.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_offset = 0;
    local_130.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&local_80);
  if (local_c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return local_298;
}

Assistant:

double Alg::max_cover_lazy_budget_fast_end(const Graph & graph, const double budget,
        const std::vector<double> & budget_list, const double epsilon, double & timeb, const int mode) {
    // mode: optimization mode.
    // 0->no optimization,
    // 1->optimization with the upper bound in the last round,
    // 2->optimization with minimum upper bound among all rounds [Default].
    const double EPS = 0.0000000001;
    __boundLast = DBL_MAX, __boundMin = DBL_MAX;
    __boundLast_inf = DBL_MAX, __boundMin_inf = DBL_MAX;
    __boundLast_inf_cost = DBL_MAX, __boundMin_inf_cost = DBL_MAX;
    FRset coverage(__numV, 0);
    size_t maxDeg = 0;
    for (auto i = __numV; i--;) {
        const size_t deg = __hyperG._FRsets[i].size();
        coverage[i] = deg;
        if (deg > maxDeg) {
            maxDeg = deg;
        }
    }
    RRsets degMap(maxDeg + 1); // degMap: map degree to the nodes with this degree
    for (auto i = __numV; i--;) {
        if (coverage[i] == 0) {
            continue;
        }
        degMap[coverage[i]].push_back(i);
    }

    size_t sumInf = 0;
    int flag = 0;
    std::vector<bool> edgeMark(__numRRsets, false);
    // check if an edge is removed
    std::vector<bool> node_sel(__numV, false);
    double min_cost = min_vector_nonzero_mask(budget_list, node_sel);
    std::cout << "min_cost: " << min_cost << std::endl;

    __vecSeed_inf.clear();
    for (size_t deg = maxDeg; deg > 0; deg--) // Enusre deg > 0
    {
        if (min_cost > budget) {
            break;
        }
        auto & vecNode = degMap[deg];
        for (auto idx = vecNode.size(); idx--;) {
            auto argmaxIdx = vecNode[idx];
            const auto currDeg = coverage[argmaxIdx];
            if (deg > currDeg)
            {
                degMap[currDeg].push_back(argmaxIdx);
                continue;
            }
            if (budget_list[argmaxIdx] <= budget) {
                if (mode == 2) {
                    // Find upper bound
                    auto degBound = deg;
                    Nodelist vecBound;
                    // Initialize vecBound
                    auto idxBound = idx;
                    vecBound.push_back(coverage[degMap[degBound][idxBound]]);
                    __boundLast_inf = double(accumulate(vecBound.begin(), vecBound.end(), size_t(0))
                                             + sumInf) * __numV /__numRRsets;
                    if (__boundMin_inf > __boundLast_inf) {
                        __boundMin_inf = __boundLast_inf;
                    }
                }
                if (flag == 0) {
                    sumInf = sumInf + coverage[argmaxIdx];
                    __vecSeed_inf.push_back(argmaxIdx);
                    coverage[argmaxIdx] = 0;
                    for (auto edgeIdx : __hyperG._FRsets[argmaxIdx])
                    {
                        if (edgeMark[edgeIdx]) continue;
                        edgeMark[edgeIdx] = true;
                        for (auto nodeIdx : __hyperG._RRsets[edgeIdx])
                        {
                            if (coverage[nodeIdx] == 0) continue; // This node is seed, skip
                            coverage[nodeIdx]--;
                        }
                    }
                }
                flag = flag + 1;
            }
            if (flag == 2) {
                break;
            }
        }
        if (flag == 2) {
            break;
        }
        degMap.pop_back();
    }
    // Top-k influential nodes constructed
    const auto finalInf = 1.0 * sumInf * __numV / __numRRsets;
    std::cout << std::endl;
    std::cout << "  >>>[greedy-lazy] influence: " << sumInf << " " << finalInf <<
              ", min-bound: " << __boundMin_inf <<
              ", last-bound: " << __boundLast_inf << '\n';

    // cost influence most
    std::vector<double> coverage_cost(__numV, 0);
    double maxDeg_cost = 0;
    double minDeg_cost = DBL_MAX;
    for (auto i = __numV; i--;) {
        const size_t deg_cost = __hyperG._FRsets[i].size();
        if (fabs(budget_list[i]) <= EPS || deg_cost == 0) {
            coverage_cost[i] = 0;
        }
        else {
            coverage_cost[i] = (double) deg_cost / budget_list[i];
        }
        if (coverage_cost[i] > maxDeg_cost) {
            maxDeg_cost = coverage_cost[i];
        }
        if (coverage_cost[i] < minDeg_cost) {
            if (fabs(coverage_cost[i]) > EPS) {
                minDeg_cost = coverage_cost[i];
            }
        }
    }
    std::cout << "minDeg_cost: " <<  minDeg_cost << std::endl;

    size_t maxIdx_cost = 0;
    for (double deg_thr = maxDeg_cost; deg_thr >= minDeg_cost * (1 - epsilon); deg_thr = deg_thr * (1 - epsilon)) {
        maxIdx_cost++;
    }

    // initial reverse index
    RRsets degMap_cost(maxIdx_cost); // degMap: map degree threshold to the nodes over this threshold
    std::cout << "maxIdx_cost: " << maxIdx_cost << std::endl;
    size_t tmpidx_cost = maxIdx_cost - 1;
    for (double deg_thr = maxDeg_cost; deg_thr >= minDeg_cost * (1 - epsilon); deg_thr = deg_thr * (1 - epsilon)) {
        for (auto i = __numV; i--; ) {
            if (coverage_cost[i] >= deg_thr && coverage_cost[i] <= deg_thr / (1 - epsilon)) {
                degMap_cost[tmpidx_cost].push_back(i);
            }
        }
        if (tmpidx_cost == 0) {
            break;
        }
        tmpidx_cost--;
    }

    size_t sumInf_cost = 0;
    double sumBudget_cost = 0;
    // miss nodes
    std::vector<size_t> miss_nodes_vec;
    RRsets missMap_cost(maxIdx_cost);
    // check if an edge is removed
    std::vector<bool> edgeMark_cost(__numRRsets, false);
    std::vector<bool> node_sel_cost(__numV, false);
    min_cost = min_vector_nonzero_mask(budget_list, node_sel_cost);

    Timer timerBound("Bound");
    __vecSeed_inf_cost.clear();
    for (size_t degidx = degMap_cost.size(); degidx--; ) {
        if (sumBudget_cost + min_cost > budget) {
            break;
        }
        auto & vecNode = degMap_cost[degidx];
        for (size_t idx = vecNode.size(); idx--;) {
            auto argmaxIdx = vecNode[idx];
            const double currDeg = coverage_cost[argmaxIdx];
            if (sumBudget_cost + budget_list[argmaxIdx] <= budget) {
                if (mode == 2 || (mode == 1 && sumBudget_cost + budget_list[argmaxIdx] + min_cost > budget)) {
                    timerBound.get_operation_time();
                    // Find upper bound
                    auto degBound = degidx;
                    Nodelist vecBound;
                    double vecBound_Budget = 0;
                    // Initialize vecBound
                    auto idxBound = idx + 1;
                    size_t lastNum = 0;
                    double vecBound_Budget_Last = 0;
                    bool is_stop = false;
                    size_t tmp_miss_idx_cost = 0;
                    for (auto miss_idx = miss_nodes_vec.size(); miss_idx--; ) {
                        tmp_miss_idx_cost = maxIdx_cost - 1;
                        for (double miss_deg_thr = maxDeg_cost;
                                miss_deg_thr >= minDeg_cost * (1 - epsilon); miss_deg_thr = miss_deg_thr * (1 - epsilon)) {
                            if (coverage_cost[miss_nodes_vec[miss_idx]] >= miss_deg_thr &&
                                    coverage_cost[miss_nodes_vec[miss_idx]] <= miss_deg_thr / (1 - epsilon)) {
                                missMap_cost[tmp_miss_idx_cost].push_back(miss_nodes_vec[miss_idx]);
                                break;
                            }
                            if (tmp_miss_idx_cost == 0) {
                                break;
                            }
                            tmp_miss_idx_cost--;
                        }
                    }
                    auto miss_idxBound = missMap_cost[degBound].size();
                    if (is_stop == false) {
                        while (vecBound_Budget + min_cost <= budget && idxBound--) {
                            if (vecBound_Budget + budget_list[degMap_cost[degBound][idxBound]] <= budget) {
                                vecBound.push_back(coverage_cost[degMap_cost[degBound][idxBound]] *
                                                   budget_list[degMap_cost[degBound][idxBound]]);
                                vecBound_Budget = vecBound_Budget + budget_list[degMap_cost[degBound][idxBound]];
                                lastNum = lastNum + 1;
                            }
                            else {
                                vecBound.push_back(coverage_cost[degMap_cost[degBound][idxBound]] *
                                                   (budget - vecBound_Budget));
                                vecBound_Budget = budget;
                                is_stop = true;
                                break;
                            }
                        }
                        while (vecBound_Budget + min_cost <= budget && miss_idxBound--) {
                            if (vecBound_Budget + budget_list[missMap_cost[degBound][miss_idxBound]] <= budget) {
                                vecBound.push_back(coverage_cost[missMap_cost[degBound][miss_idxBound]] *
                                                   budget_list[missMap_cost[degBound][miss_idxBound]]);
                                vecBound_Budget = vecBound_Budget + budget_list[missMap_cost[degBound][miss_idxBound]];
                                lastNum = lastNum + 1;
                            }
                            else {
                                vecBound.push_back(coverage_cost[missMap_cost[degBound][miss_idxBound]] *
                                                   (budget - vecBound_Budget));
                                vecBound_Budget = budget;
                                is_stop = true;
                                break;
                            }
                        }
                    }
                    if (is_stop == false) {
                        while (vecBound_Budget + min_cost <= budget && --degBound) {
                            lastNum = 0;
                            vecBound_Budget_Last = vecBound_Budget;
                            idxBound = degMap_cost[degBound].size();
                            miss_idxBound = missMap_cost[degBound].size();
                            while (vecBound_Budget + min_cost <= budget && idxBound--) {
                                if (vecBound_Budget + budget_list[degMap_cost[degBound][idxBound]] <= budget) {
                                    vecBound.push_back(coverage_cost[degMap_cost[degBound][idxBound]] *
                                                       budget_list[degMap_cost[degBound][idxBound]]);
                                    vecBound_Budget = vecBound_Budget + budget_list[degMap_cost[degBound][idxBound]];
                                    lastNum = lastNum + 1;
                                }
                                else {
                                    vecBound.push_back(coverage_cost[degMap_cost[degBound][idxBound]] *
                                                       (budget - vecBound_Budget));
                                    vecBound_Budget = budget;
                                    is_stop = true;
                                    break;
                                }
                            }
                            while (vecBound_Budget + min_cost <= budget && miss_idxBound--) {
                                if (vecBound_Budget + budget_list[missMap_cost[degBound][miss_idxBound]] <= budget) {
                                    vecBound.push_back(coverage_cost[missMap_cost[degBound][miss_idxBound]] *
                                                       budget_list[missMap_cost[degBound][miss_idxBound]]);
                                    vecBound_Budget = vecBound_Budget + budget_list[missMap_cost[degBound][miss_idxBound]];
                                    lastNum = lastNum + 1;
                                }
                                else {
                                    vecBound.push_back(coverage_cost[missMap_cost[degBound][miss_idxBound]] *
                                                       (budget - vecBound_Budget));
                                    vecBound_Budget = budget;
                                    is_stop = true;
                                    break;
                                }
                            }
                            if (is_stop == true) {
                                break;
                            }
                        }
                    }
                    // roll back
                    if (lastNum != 0 && idxBound != 0) {
                        while (lastNum) {
                            vecBound.pop_back();
                            lastNum = lastNum - 1;
                        }
                        vecBound_Budget = vecBound_Budget_Last;
                        std::vector<std::pair<size_t, double>> vecNodeLastPair(degMap_cost[degBound].size()
                            + missMap_cost[degBound].size());
                        for (size_t idxpair = degMap_cost[degBound].size(); idxpair--; ) {
                            vecNodeLastPair[idxpair] = std::make_pair(degMap_cost[degBound][idxpair],
                                                                      coverage_cost[degMap_cost[degBound][idxpair]]);
                        }
                        for (size_t miss_idxpair = missMap_cost[degBound].size(); miss_idxpair--; ){
                            vecNodeLastPair[miss_idxpair + degMap_cost[degBound].size()] =
                                    std::make_pair(missMap_cost[degBound][miss_idxpair],
                                            coverage_cost[missMap_cost[degBound][miss_idxpair]]);
                        }
                        std::sort(vecNodeLastPair.begin(), vecNodeLastPair.end(), [](auto & left, auto & right){
                            return std::get<1>(left) < std::get<1>(right);
                        });
                        // choose max
                        idxBound = degMap_cost[degBound].size() + missMap_cost[degBound].size();
                        while (vecBound_Budget + min_cost <= budget && idxBound--) {
                            if (vecBound_Budget + budget_list[std::get<0>(vecNodeLastPair[idxBound])] <= budget) {
                                vecBound.push_back(coverage_cost[std::get<0>(vecNodeLastPair[idxBound])] *
                                                   budget_list[std::get<0>(vecNodeLastPair[idxBound])]);
                                vecBound_Budget = vecBound_Budget + budget_list[std::get<0>(vecNodeLastPair[idxBound])];
                            }
                            else {
                                vecBound.push_back(coverage_cost[std::get<0>(vecNodeLastPair[idxBound])] *
                                                   (budget- vecBound_Budget));
                                vecBound_Budget = budget;
                            }
                        }
                    }
                    else if (idxBound == 0 && vecBound_Budget < budget) {
                        double max_coverage_ratio = 0.0;
                        degBound = degBound - 1;
                        for (size_t idxpair = degMap_cost[degBound].size(); idxpair--; ) {
                            if (coverage_cost[degMap_cost[degBound][idxpair]] > max_coverage_ratio) {
                                max_coverage_ratio = coverage_cost[degMap_cost[degBound][idxpair]];
                            }
                        }
                        for (size_t miss_idxpair = missMap_cost[degBound].size(); miss_idxpair--; ) {
                            if (coverage_cost[missMap_cost[degBound][miss_idxpair]] > max_coverage_ratio) {
                                max_coverage_ratio = coverage_cost[missMap_cost[degBound][miss_idxpair]];
                            }
                        }
                        vecBound.push_back(max_coverage_ratio * (budget- vecBound_Budget));
                    }
                    std::sort(vecBound.begin(), vecBound.end());
                    make_min_heap(vecBound);
                    __boundLast_inf_cost = double(accumulate(vecBound.begin(), vecBound.end(), size_t(0))
                                                  + sumInf_cost) * __numV /__numRRsets;
                    if (__boundMin_inf_cost > __boundLast_inf_cost) {
                        __boundMin_inf_cost = __boundLast_inf_cost;
                    }
                    timeb += timerBound.get_operation_time();
                }
                sumInf_cost = sumInf_cost + currDeg * budget_list[argmaxIdx];
                __vecSeed_inf_cost.push_back(argmaxIdx);
                sumBudget_cost = sumBudget_cost + budget_list[argmaxIdx];
                coverage_cost[argmaxIdx] = 0;
                node_sel_cost[argmaxIdx] = true;
                min_cost = min_vector_nonzero_mask(budget_list, node_sel_cost);
                for (auto edgeIdx : __hyperG._FRsets[argmaxIdx]) {
                    if (edgeMark_cost[edgeIdx]) {
                        continue;
                    }
                    edgeMark_cost[edgeIdx] = true;
                    for (auto nodeIdx : __hyperG._RRsets[edgeIdx]) {
                        if (fabs(coverage_cost[nodeIdx]) <= EPS) {
                            continue; // This node is seed, skip
                        }
                        if (fabs(budget_list[nodeIdx]) >= EPS) {
                            coverage_cost[nodeIdx] = (coverage_cost[nodeIdx] * budget_list[nodeIdx] - 1) /
                                                     budget_list[nodeIdx];
                        } else {
                            coverage_cost[nodeIdx] = 0;
                        }
                    }
                }
                degMap_cost[degidx].pop_back();
            }
            else {
                if (fabs(coverage_cost[argmaxIdx]) > EPS) {
                    miss_nodes_vec.push_back(argmaxIdx);
//                    std::cout << "miss node size: " << miss_nodes_vec.size() << std::endl;
                }
                degMap_cost[degidx].pop_back();
            }
            if (sumBudget_cost + min_cost > budget) {
                break;
            }
        }
        degMap_cost.pop_back();
    }
    const auto finalInf_cost = 1.0 * sumInf_cost * __numV / __numRRsets;
    std::cout << "  >>>[greedy-lazy] influence_cost: " << sumInf_cost << " " <<
              finalInf_cost << ", min-bound_cost: " <<
              __boundMin_inf_cost << ", last-bound_cost: " << __boundLast_inf_cost << '\n';

    if (finalInf > finalInf_cost) {
        __vecSeed.clear();
        __vecSeed.assign(__vecSeed_inf.begin(), __vecSeed_inf.end());
        std::cout << "Inf: " <<  __vecSeed.size() << std::endl;
        __is_inf_cost = false;
        return finalInf;
    }
    else {
        __vecSeed.clear();
        __vecSeed.assign(__vecSeed_inf_cost.begin(), __vecSeed_inf_cost.end());
        std::cout << "Cost Inf: " << __vecSeed.size() << std::endl;
        __is_inf_cost = true;
        return finalInf_cost;
    }
}